

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# secp256k1.c
# Opt level: O0

int secp256k1_ec_pubkey_cmp
              (secp256k1_context *ctx,secp256k1_pubkey *pubkey0,secp256k1_pubkey *pubkey1)

{
  ulong uVar1;
  undefined8 uVar2;
  int iVar3;
  undefined8 in_RDX;
  secp256k1_pubkey *in_RSI;
  size_t *in_RDI;
  size_t out_size;
  secp256k1_context *in_stack_00000008;
  int i;
  secp256k1_pubkey *pk [2];
  uchar out [2] [33];
  int local_7c;
  undefined1 local_68 [33];
  undefined1 auStack_47 [51];
  
  if (in_RDI == (size_t *)0x0) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/mzumsande[P]bitcoin/src/secp256k1/src/secp256k1.c"
            ,0x128,"test condition failed: ctx != NULL");
    abort();
  }
  unique0x10000139 = in_RDX;
  for (local_7c = 0; uVar2 = stack0xffffffffffffffe8, local_7c < 2; local_7c = local_7c + 1) {
    uVar1 = (ulong)stack0xffffffffffffffe8 >> 0x20;
    iVar3 = secp256k1_ec_pubkey_serialize
                      (in_stack_00000008,(uchar *)out_size,in_RDI,in_RSI,(uint)uVar1);
    stack0xffffffffffffffe8 = uVar2;
    if (iVar3 == 0) {
      memset(local_68 + (long)local_7c * 0x21,0,0x21);
    }
  }
  iVar3 = secp256k1_memcmp_var(local_68,auStack_47,0x21);
  return iVar3;
}

Assistant:

int secp256k1_ec_pubkey_cmp(const secp256k1_context* ctx, const secp256k1_pubkey* pubkey0, const secp256k1_pubkey* pubkey1) {
    unsigned char out[2][33];
    const secp256k1_pubkey* pk[2];
    int i;

    VERIFY_CHECK(ctx != NULL);
    pk[0] = pubkey0; pk[1] = pubkey1;
    for (i = 0; i < 2; i++) {
        size_t out_size = sizeof(out[i]);
        /* If the public key is NULL or invalid, ec_pubkey_serialize will call
         * the illegal_callback and return 0. In that case we will serialize the
         * key as all zeros which is less than any valid public key. This
         * results in consistent comparisons even if NULL or invalid pubkeys are
         * involved and prevents edge cases such as sorting algorithms that use
         * this function and do not terminate as a result. */
        if (!secp256k1_ec_pubkey_serialize(ctx, out[i], &out_size, pk[i], SECP256K1_EC_COMPRESSED)) {
            /* Note that ec_pubkey_serialize should already set the output to
             * zero in that case, but it's not guaranteed by the API, we can't
             * test it and writing a VERIFY_CHECK is more complex than
             * explicitly memsetting (again). */
            memset(out[i], 0, sizeof(out[i]));
        }
    }
    return secp256k1_memcmp_var(out[0], out[1], sizeof(out[0]));
}